

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_item.c
# Opt level: O2

TestItem * create_test_item_from(char *specification_name)

{
  TestItem *pTVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  
  pTVar1 = (TestItem *)malloc(0x18);
  pcVar2 = strdup(specification_name);
  pTVar1->specification_name = pcVar2;
  pcVar4 = specification_name + 0xc;
  pcVar2 = skip_to_separator(pcVar4);
  pcVar2 = string_copy_of(pcVar4,pcVar2);
  pTVar1->context_name = pcVar2;
  pcVar2 = strstr(pcVar4,"__");
  pcVar2 = pcVar2 + 2;
  pcVar4 = skip_to_separator(pcVar2);
  if (pcVar4 == (char *)0x0) {
    sVar3 = strlen(pcVar2);
    pcVar4 = pcVar2 + sVar3;
  }
  pcVar2 = string_copy_of(pcVar2,pcVar4);
  pTVar1->test_name = pcVar2;
  return pTVar1;
}

Assistant:

TestItem *create_test_item_from(const char *specification_name) {
    TestItem *test_item = (TestItem *)malloc(sizeof(TestItem));

    test_item->specification_name = strdup(specification_name);
    test_item->context_name = context_name_from(specification_name);
    test_item->test_name = test_name_from(specification_name);

    return test_item;
}